

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeStructGet<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool signed_)

{
  __index_type *__return_storage_ptr___00;
  HeapTypeT *pHVar1;
  HeapType type_00;
  uint *puVar2;
  Result<wasm::Ok> *pRVar3;
  bool bVar4;
  HeapTypeT type_01;
  Err local_148;
  Err *local_128;
  Err *err_1;
  Result<unsigned_int> _val_1;
  undefined1 local_e8 [8];
  Result<unsigned_int> field;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> _val;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  bool signed__local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.
               super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
       + 0x20);
  pRVar3 = __return_storage_ptr__;
  typeidx<wasm::WATParser::ParseDefsCtx>
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             __return_storage_ptr___00,ctx);
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::Result
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             local_80,(Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                       *)__return_storage_ptr___00);
  local_98 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
             getErr((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                     *)local_80);
  field.val.super__Variant_base<unsigned_int,_wasm::Err>.
  super__Move_assign_alias<unsigned_int,_wasm::Err>.
  super__Copy_assign_alias<unsigned_int,_wasm::Err>.super__Move_ctor_alias<unsigned_int,_wasm::Err>.
  super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
  super__Variant_storage_alias<unsigned_int,_wasm::Err>._36_1_ = local_98 != (Err *)0x0;
  if ((bool)field.val.super__Variant_base<unsigned_int,_wasm::Err>.
            super__Move_assign_alias<unsigned_int,_wasm::Err>.
            super__Copy_assign_alias<unsigned_int,_wasm::Err>.
            super__Move_ctor_alias<unsigned_int,_wasm::Err>.
            super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
            super__Variant_storage_alias<unsigned_int,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_b8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  field.val.super__Variant_base<unsigned_int,_wasm::Err>.
  super__Move_assign_alias<unsigned_int,_wasm::Err>.
  super__Copy_assign_alias<unsigned_int,_wasm::Err>.super__Move_ctor_alias<unsigned_int,_wasm::Err>.
  super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
  super__Variant_storage_alias<unsigned_int,_wasm::Err>._37_3_ = 0;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::~Result
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             local_80);
  if (field.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._36_4_ == 0) {
    pHVar1 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
             operator*((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                        *)((long)&_val.val.
                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                          + 0x20));
    _val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::Err>.super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = (pHVar1->type).id;
    type_01.type.id = *(ulong *)&pHVar1->exactness & 0xffffffff;
    type_01._8_8_ = pRVar3;
    fieldidx<wasm::WATParser::ParseDefsCtx>
              ((Result<unsigned_int> *)local_e8,(WATParser *)ctx,
               (ParseDefsCtx *)
               _val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_,type_01);
    Result<unsigned_int>::Result((Result<unsigned_int> *)&err_1,(Result<unsigned_int> *)local_e8);
    local_128 = Result<unsigned_int>::getErr((Result<unsigned_int> *)&err_1);
    bVar4 = local_128 != (Err *)0x0;
    if (bVar4) {
      wasm::Err::Err(&local_148,local_128);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_148);
      wasm::Err::~Err(&local_148);
    }
    field.val.super__Variant_base<unsigned_int,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::Err>.super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::Err>._37_3_ = 0;
    field.val.super__Variant_base<unsigned_int,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::Err>.super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::Err>._36_1_ = bVar4;
    Result<unsigned_int>::~Result((Result<unsigned_int> *)&err_1);
    if (field.val.super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err>._36_4_ == 0) {
      pHVar1 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
               operator*((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                          *)((long)&_val.val.
                                    super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                            + 0x20));
      type_00 = TypeParserCtx::HeapTypeT::operator_cast_to_HeapType((HeapTypeT *)pHVar1);
      puVar2 = Result<unsigned_int>::operator*((Result<unsigned_int> *)local_e8);
      ParseDefsCtx::makeStructGet
                (__return_storage_ptr__,ctx,pos,annotations,type_00,*puVar2,signed_,Unordered);
      field.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._36_4_ = 1;
    }
    Result<unsigned_int>::~Result((Result<unsigned_int> *)local_e8);
  }
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::~Result
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             ((long)&_val.val.
                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStructGet(Ctx& ctx,
                       Index pos,
                       const std::vector<Annotation>& annotations,
                       bool signed_) {
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructGet(
    pos, annotations, *type, *field, signed_, MemoryOrder::Unordered);
}